

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.h
# Opt level: O0

void __thiscall
ZXing::ImageView::ImageView
          (ImageView *this,uint8_t *data,int width,int height,ImageFormat format,int rowStride,
          int pixStride)

{
  invalid_argument *piVar1;
  undefined4 in_ECX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  ImageFormat in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int local_54;
  int local_44;
  
  *in_RDI = in_RSI;
  *(ImageFormat *)(in_RDI + 1) = in_R8D;
  *(int *)((long)in_RDI + 0xc) = in_EDX;
  *(undefined4 *)(in_RDI + 2) = in_ECX;
  if (in_stack_00000008 == 0) {
    local_44 = PixStride(in_R8D);
  }
  else {
    local_44 = in_stack_00000008;
  }
  *(int *)((long)in_RDI + 0x14) = local_44;
  local_54 = in_R9D;
  if (in_R9D == 0) {
    local_54 = in_EDX * *(int *)((long)in_RDI + 0x14);
  }
  *(int *)(in_RDI + 3) = local_54;
  if ((((*in_RDI == 0) && (*(int *)((long)in_RDI + 0xc) == 0)) && ((int)in_RDI[2] == 0)) &&
     ((in_R9D == 0 && (in_stack_00000008 == 0)))) {
    fprintf(_stderr,
            "zxing-cpp deprecation warning: ImageView(nullptr, ...) will throw in the future, use ImageView()\n"
           );
  }
  else {
    if (*in_RDI == 0) {
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar1,"Can not construct an ImageView from a NULL pointer");
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if ((*(int *)((long)in_RDI + 0xc) < 1) || ((int)in_RDI[2] < 1)) {
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar1,"Neither width nor height of ImageView can be less or equal to 0");
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return;
}

Assistant:

ImageView(const uint8_t* data, int width, int height, ImageFormat format, int rowStride = 0, int pixStride = 0)
		: _data(data),
		  _format(format),
		  _width(width),
		  _height(height),
		  _pixStride(pixStride ? pixStride : PixStride(format)),
		  _rowStride(rowStride ? rowStride : width * _pixStride)
	{
		// TODO: [[deprecated]] this check is to prevent exising code from suddenly throwing, remove in 3.0
		if (_data == nullptr && _width == 0 && _height == 0 && rowStride == 0 && pixStride == 0) {
			fprintf(stderr, "zxing-cpp deprecation warning: ImageView(nullptr, ...) will throw in the future, use ImageView()\n");
			return;
		}

		if (_data == nullptr)
			throw std::invalid_argument("Can not construct an ImageView from a NULL pointer");

		if (_width <= 0 || _height <= 0)
			throw std::invalid_argument("Neither width nor height of ImageView can be less or equal to 0");
	}